

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_NewFrame(void)

{
  float fVar1;
  float _y;
  double dVar2;
  float v_3;
  float v_2;
  float v_1;
  float v;
  uchar *buttons;
  float *axes;
  int buttons_count;
  int axes_count;
  double current_time;
  int display_h;
  int display_w;
  int h;
  int w;
  ImGuiIO *io;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ImVec2 local_28;
  ImVec2 local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  ImGuiIO *local_8;
  
  local_8 = ImGui::GetIO();
  glfwGetWindowSize((GLFWwindow *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  glfwGetFramebufferSize
            ((GLFWwindow *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  ImVec2::ImVec2(&local_20,(float)local_c,(float)local_10);
  local_8->DisplaySize = local_20;
  if (local_c < 1) {
    fVar1 = 0.0;
  }
  else {
    fVar1 = (float)local_14 / (float)local_c;
  }
  if (local_10 < 1) {
    _y = 0.0;
  }
  else {
    _y = (float)local_18 / (float)local_10;
  }
  ImVec2::ImVec2(&local_28,fVar1,_y);
  local_8->DisplayFramebufferScale = local_28;
  dVar2 = glfwGetTime();
  if (g_Time <= 0.0) {
    fVar1 = 0.016666668;
  }
  else {
    fVar1 = (float)(dVar2 - g_Time);
  }
  local_8->DeltaTime = fVar1;
  g_Time = dVar2;
  ImGui_ImplGlfw_UpdateMousePosAndButtons();
  ImGui_ImplGlfw_UpdateMouseCursor();
  memset(local_8->NavInputs,0,0x54);
  if ((local_8->ConfigFlags & 2U) != 0) {
    glfwGetJoystickAxes((int)_y,(int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                       );
    glfwGetJoystickButtons
              ((int)_y,(int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if (local_8->NavInputs[8] < -0.0) {
      local_8->NavInputs[8] = -0.0;
    }
    if (local_8->NavInputs[9] < 0.0) {
      local_8->NavInputs[9] = 0.0;
    }
    if (local_8->NavInputs[10] < 0.0) {
      local_8->NavInputs[10] = 0.0;
    }
    if (local_8->NavInputs[0xb] < -0.0) {
      local_8->NavInputs[0xb] = -0.0;
    }
    local_8->BackendFlags = local_8->BackendFlags & 0xfffffffe;
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_NewFrame()
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(g_Window, &w, &h);
    glfwGetFramebufferSize(g_Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    io.DisplayFramebufferScale = ImVec2(w > 0 ? ((float)display_w / w) : 0, h > 0 ? ((float)display_h / h) : 0);

    // Setup time step
    double current_time = glfwGetTime();
    io.DeltaTime = g_Time > 0.0 ? (float)(current_time - g_Time) : (float)(1.0f/60.0f);
    g_Time = current_time;

    ImGui_ImplGlfw_UpdateMousePosAndButtons();
    ImGui_ImplGlfw_UpdateMouseCursor();

    // Gamepad navigation mapping
    memset(io.NavInputs, 0, sizeof(io.NavInputs));
    if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)
    {
        // Update gamepad inputs
        #define MAP_BUTTON(NAV_NO, BUTTON_NO)       { if (buttons_count > BUTTON_NO && buttons[BUTTON_NO] == GLFW_PRESS) io.NavInputs[NAV_NO] = 1.0f; }
        #define MAP_ANALOG(NAV_NO, AXIS_NO, V0, V1) { float v = (axes_count > AXIS_NO) ? axes[AXIS_NO] : V0; v = (v - V0) / (V1 - V0); if (v > 1.0f) v = 1.0f; if (io.NavInputs[NAV_NO] < v) io.NavInputs[NAV_NO] = v; }
        int axes_count = 0, buttons_count = 0;
        const float* axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1, &axes_count);
        const unsigned char* buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1, &buttons_count);
        MAP_BUTTON(ImGuiNavInput_Activate,   0);     // Cross / A
        MAP_BUTTON(ImGuiNavInput_Cancel,     1);     // Circle / B
        MAP_BUTTON(ImGuiNavInput_Menu,       2);     // Square / X
        MAP_BUTTON(ImGuiNavInput_Input,      3);     // Triangle / Y
        MAP_BUTTON(ImGuiNavInput_DpadLeft,   13);    // D-Pad Left
        MAP_BUTTON(ImGuiNavInput_DpadRight,  11);    // D-Pad Right
        MAP_BUTTON(ImGuiNavInput_DpadUp,     10);    // D-Pad Up
        MAP_BUTTON(ImGuiNavInput_DpadDown,   12);    // D-Pad Down
        MAP_BUTTON(ImGuiNavInput_FocusPrev,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_FocusNext,  5);     // R1 / RB
        MAP_BUTTON(ImGuiNavInput_TweakSlow,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_TweakFast,  5);     // R1 / RB
        MAP_ANALOG(ImGuiNavInput_LStickLeft, 0,  -0.3f,  -0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickRight,0,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickUp,   1,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickDown, 1,  -0.3f,  -0.9f);
        #undef MAP_BUTTON
        #undef MAP_ANALOG
        if (axes_count > 0 && buttons_count > 0)
            io.BackendFlags |= ImGuiBackendFlags_HasGamepad;
        else
            io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
    }
}